

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::blitStencilToColor2D
               (RenderContext *renderCtx,deUint32 srcTex,int width,int height)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  ProgramSources *pPVar5;
  undefined4 extraout_var;
  TestError *this;
  long lVar6;
  allocator<char> local_27a;
  allocator<char> local_279;
  string local_278;
  deUint8 indices [6];
  float texCoord [8];
  float positions [8];
  VertexArrayBinding vertexArrays [2];
  ShaderProgram program;
  
  memset(vertexArrays,0,0xac);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_texCoord;\nout highp vec2 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
             ,&local_27a);
  glu::VertexSource::VertexSource((VertexSource *)positions,&local_278);
  pPVar5 = glu::ProgramSources::operator<<((ProgramSources *)vertexArrays,(ShaderSource *)positions)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)indices,
             "#version 300 es\nuniform highp usampler2D u_sampler;\nin highp vec2 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
             ,&local_279);
  glu::FragmentSource::FragmentSource((FragmentSource *)texCoord,(string *)indices);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)texCoord);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar5);
  std::__cxx11::string::~string((string *)(texCoord + 2));
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)(positions + 2));
  std::__cxx11::string::~string((string *)&local_278);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  positions[4] = -1.0;
  positions[5] = 1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = 1.0;
  positions[3] = -1.0;
  texCoord[4] = 0.0;
  texCoord[5] = 1.0;
  texCoord[6] = 1.0;
  texCoord[7] = 1.0;
  texCoord[0] = 0.0;
  texCoord[1] = 0.0;
  texCoord[2] = 1.0;
  texCoord[3] = 0.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"a_position",&local_27a);
  glu::va::Float(vertexArrays,&local_278,2,4,0,positions);
  std::__cxx11::string::string<std::allocator<char>>((string *)indices,"a_texCoord",&local_279);
  glu::va::Float(vertexArrays + 1,(string *)indices,2,4,0,texCoord);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&local_278);
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  iVar2 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar6 = CONCAT44(extraout_var,iVar2);
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar6 + 8))(0x84c0);
    (**(code **)(lVar6 + 0xb8))(0xde1,srcTex);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
    (**(code **)(lVar6 + 0x1360))(0xde1,0x90ea,0x1901);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0xfd);
    (**(code **)(lVar6 + 0x1680))(program.m_program.m_program);
    pcVar1 = *(code **)(lVar6 + 0x14f0);
    uVar4 = (**(code **)(lVar6 + 0xb48))(program.m_program.m_program,"u_sampler");
    (*pcVar1)(uVar4,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x101);
    (**(code **)(lVar6 + 0x1a00))(0,0,width,height);
    local_278._M_dataplus._M_p = (pointer)0x600000000;
    local_278._M_string_length._0_4_ = 0;
    local_278.field_2._M_allocated_capacity = (size_type)(string *)indices;
    glu::draw(renderCtx,program.m_program.m_program,2,vertexArrays,(PrimitiveList *)&local_278,
              (DrawUtilCallback *)0x0);
    lVar6 = 0x58;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar6));
      lVar6 = lVar6 + -0x50;
    } while (lVar6 != -0x48);
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Compile failed",&local_27a);
  tcu::TestError::TestError(this,&local_278);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void blitStencilToColor2D (const glu::RenderContext& renderCtx, deUint32 srcTex, int width, int height)
{
	const glu::ShaderProgram program(renderCtx, glu::ProgramSources()
		<< glu::VertexSource(
			"#version 300 es\n"
			"in highp vec4 a_position;\n"
			"in highp vec2 a_texCoord;\n"
			"out highp vec2 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_texCoord = a_texCoord;\n"
			"}\n")
		<< glu::FragmentSource(
			"#version 300 es\n"
			"uniform highp usampler2D u_sampler;\n"
			"in highp vec2 v_texCoord;\n"
			"layout(location = 0) out highp uint o_stencil;\n"
			"void main (void)\n"
			"{\n"
			"	o_stencil = texture(u_sampler, v_texCoord).x;\n"
			"}\n"));

	const float positions[] =
	{
		-1.0f, -1.0f,
		+1.0f, -1.0f,
		-1.0f, +1.0f,
		+1.0f, +1.0f
	};
	const float texCoord[] =
	{
		0.0f, 0.0f,
		1.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 1.0f
	};
	const glu::VertexArrayBinding vertexArrays[] =
	{
		glu::va::Float("a_position", 2, 4, 0, &positions[0]),
		glu::va::Float("a_texCoord", 2, 4, 0, &texCoord[0])
	};
	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	const glw::Functions& gl = renderCtx.getFunctions();

	if (!program.isOk())
		throw tcu::TestError("Compile failed");

	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, srcTex);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, GL_STENCIL_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture state setup failed");

	gl.useProgram(program.getProgram());
	gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_sampler"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.viewport(0, 0, width, height);
	glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
}